

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O0

void __thiscall
level_mesh::push(level_mesh *this,uint16_t sector,xr_vbuf *vb,xr_ibuf *ib,uint16_t texture,
                uint16_t eshader,fmatrix *xform)

{
  bool bVar1;
  undefined1 local_70 [8];
  b_face face_template;
  uint16_t eshader_local;
  uint16_t texture_local;
  xr_ibuf *ib_local;
  xr_vbuf *vb_local;
  uint16_t sector_local;
  level_mesh *this_local;
  
  face_template.temp = eshader;
  face_template.sector = texture;
  xray_re::xr_mesh_builder::b_face::b_face((b_face *)local_70,sector);
  xray_re::xr_raw_surface::set
            ((xr_raw_surface *)((long)&face_template.field_0 + 0x28),face_template.sector,
             face_template.temp,0xffff,2);
  bVar1 = xray_re::xr_vbuf::has_lightmaps(vb);
  if (bVar1) {
    face_template.field_0.field_0.link[2]._2_2_ = face_template.field_0.field_0.link[2]._2_2_ | 4;
  }
  xray_re::xr_mesh_builder::__push(&this->super_xr_mesh_builder,vb,ib,xform,(b_face *)local_70,0);
  return;
}

Assistant:

void level_mesh::push(uint16_t sector, const xr_vbuf& vb, const xr_ibuf& ib,
	uint16_t texture, uint16_t eshader, const fmatrix& xform)
{
	b_face face_template(sector);
	face_template.surface.set(texture, eshader);
	if (vb.has_lightmaps())
		face_template.surface.flags |= RSF_LIGHTMAP;
	xr_mesh_builder::__push(vb, ib, &xform, face_template);
}